

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreFind.h
# Opt level: O3

BoyerMooreTextFindResult * __thiscall
axl::sl::
BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8Decoder,_false,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
::find(BoyerMooreTextFindResult *__return_storage_ptr__,
      BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8Decoder,_false,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
      *this,BoyerMooreTextState *state,void *p0,size_t size,utf32_t replacementChar)

{
  BoyerMooreTextFindResult *pBVar1;
  BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8Decoder,_false,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
  *pBVar2;
  SrcUnit *bin;
  size_t i;
  size_t binOffset;
  ulong length;
  size_t binSize;
  size_t textLength;
  Result RVar3;
  DecoderState decoderState;
  utf32_t local_46c;
  BoyerMooreTextFindResult *local_468;
  BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8Decoder,_false,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
  *local_460;
  SrcUnit *local_458;
  SrcUnit *local_450;
  BoyerMooreTextAccessor accessor;
  utf32_t buffer [256];
  DstUnit local_38 [2];
  
  decoderState = state->m_decoderState;
  local_468 = __return_storage_ptr__;
  if (0 < (long)size) {
    local_450 = (SrcUnit *)(size + (long)p0);
    local_46c = replacementChar;
    local_460 = &this->
                 super_BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8Decoder,_false,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
    ;
    do {
      local_458 = (SrcUnit *)p0;
      RVar3 = enc::
              Convert<axl::enc::Utf32,_axl::enc::Utf8,_axl::enc::ToCaseFolded,_axl::enc::Utf8Decoder>
              ::convert(&decoderState,buffer,local_38,(SrcUnit *)p0,local_450,local_46c);
      pBVar2 = local_460;
      p0 = RVar3.m_src;
      textLength = (long)RVar3.m_dst - (long)buffer >> 2;
      length = (state->super_BoyerMooreStateBase<wchar_t>).m_tail.m_length + textLength;
      accessor.super_BoyerMooreIncrementalAccessorBase<wchar_t,_false,_axl::sl::BoyerMooreTextState>
      .m_state = state;
      accessor.super_BoyerMooreIncrementalAccessorBase<wchar_t,_false,_axl::sl::BoyerMooreTextState>
      .m_p = buffer;
      i = BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8Decoder,_false,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
          ::findImpl<axl::sl::BoyerMooreTextAccessor>(local_460,&accessor,0,length);
      bin = local_458;
      pBVar1 = local_468;
      if (i + (pBVar2->m_pattern).super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>.m_count
          <= length) {
        createFindResult(local_468,
                         (BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8Decoder,_false,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
                          *)local_460,state,i,local_458,(char *)p0);
        return pBVar1;
      }
      binSize = (long)p0 - (long)local_458;
      binOffset = locateBinOffset(state,i,local_458,(char *)p0);
      BoyerMooreTextState::advance<false>
                (state,i,buffer,textLength,binOffset,bin,binSize,decoderState);
    } while (p0 < local_450);
  }
  *(undefined4 *)&local_468->m_charOffset = 0xffffffff;
  *(undefined4 *)((long)&local_468->m_charOffset + 4) = 0xffffffff;
  *(undefined4 *)&local_468->m_binOffset = 0xffffffff;
  *(undefined4 *)((long)&local_468->m_binOffset + 4) = 0xffffffff;
  local_468->m_binEndOffset = 0xffffffffffffffff;
  return local_468;
}

Assistant:

BoyerMooreTextFindResult
	find(
		BoyerMooreTextState* state,
		const void* p0,
		size_t size,
		utf32_t replacementChar = enc::StdChar_Replacement
	) const {
		ASSERT(state->getPatternLength() == this->m_pattern.getCount());

		sl::PtrIterator<const char, IsReverse> p(IsReverse ? (char*)p0 + size - 1 : (char*)p0);
		const char* end = p + size;

		enc::DecoderState decoderState = state->getDecoderState();

		while (p < end) {
			utf32_t buffer[Details::DecoderBufferLength];

			typename Convert::Result convertResult = Convert::convert(
				&decoderState,
				buffer,
				buffer + countof(buffer),
				p,
				end,
				replacementChar
			);

			const char* p2 = convertResult.m_src; // just a short alias
			size_t srcLength = -(p - p2); // respect IsReverse
			size_t dstLength = convertResult.m_dst - buffer;
			size_t fullLength = state->getTailLength() + dstLength;
			size_t i;

			BoyerMooreTextAccessor accessor(state, buffer);

			if (IsWholeWord) {
				i = findWholeWordImpl(state, accessor, fullLength);
				if (i + this->m_pattern.getCount() < fullLength) // account for suffix
					return createFindResult(state, i, p, p2);

			} else {
				i = this->findImpl(accessor, 0, fullLength);
				if (i + this->m_pattern.getCount() <= fullLength)
					return createFindResult(state, i, p, p2);
			}

			// locate bin-offset of the prospective start of match
			size_t binOffset = locateBinOffset(state, i, p, p2);

			state->advance<IsReverse>(
				i,
				buffer,
				dstLength,
				binOffset,
				IsReverse ? p2 + 1 : (const char*)p,
				srcLength,
				decoderState
			);

 			ASSERT(state->getBinTailSize() >= state->getTailLength());
			p = p2;
		}

		return BoyerMooreTextFindResult();
	}